

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimCreator.cpp
# Opt level: O3

void __thiscall OpenMD::SimCreator::computeStorageLayouts(SimCreator *this,SimInfo *info)

{
  int iVar1;
  Globals *pGVar2;
  RNEMDParameters *this_00;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  byte bVar21;
  byte bVar22;
  MultipoleAdapter ma;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  PolarizableAdapter pa;
  SuttonChenAdapter sca;
  EAMAdapter ea;
  DirectionalAdapter da;
  AtomTypeSet atomTypes;
  byte local_c8;
  byte local_c4;
  MultipoleAdapter local_a0;
  _Rb_tree_node_base *local_98;
  FluctuatingChargeAdapter local_90;
  FixedChargeAdapter local_88;
  PolarizableAdapter local_80;
  SuttonChenAdapter local_78;
  EAMAdapter local_70;
  DirectionalAdapter local_68;
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  local_60;
  
  pGVar2 = info->simParams_;
  iVar1 = info->nGlobalRigidBodies_;
  SimInfo::getSimulatedAtomTypes((AtomTypeSet *)&local_60,info);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left ==
      &local_60._M_impl.super__Rb_tree_header) {
    uVar17 = 0x3f;
    if (iVar1 < 1) {
      uVar17 = 0;
    }
    uVar18 = 7;
  }
  else {
    bVar4 = false;
    bVar16 = false;
    local_c8 = 0;
    local_c4 = 0;
    bVar5 = local_c4;
    bVar6 = local_c8;
    bVar7 = 0;
    bVar8 = 0;
    bVar9 = 0;
    do {
      bVar3 = bVar9;
      bVar22 = bVar8;
      bVar21 = bVar7;
      local_c8 = bVar6;
      local_c4 = bVar5;
      local_a0.at_ = *(AtomType **)(local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1);
      local_98 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      local_90.at_ = local_a0.at_;
      local_88.at_ = local_a0.at_;
      local_80.at_ = local_a0.at_;
      local_78.at_ = local_a0.at_;
      local_70.at_ = local_a0.at_;
      local_68.at_ = local_a0.at_;
      bVar10 = DirectionalAdapter::isDirectional(&local_68);
      bVar11 = MultipoleAdapter::isDipole(&local_a0);
      bVar12 = MultipoleAdapter::isQuadrupole(&local_a0);
      bVar13 = EAMAdapter::isEAM(&local_70);
      if ((bVar13) || (bVar13 = SuttonChenAdapter::isSuttonChen(&local_78), bVar13)) {
        bVar4 = true;
      }
      bVar13 = FixedChargeAdapter::isFixedCharge(&local_88);
      bVar14 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_90);
      bVar15 = PolarizableAdapter::isPolarizable(&local_80);
      if (bVar14) {
        bVar16 = true;
      }
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)std::_Rb_tree_increment(local_98);
      bVar5 = local_c4 | bVar11;
      bVar6 = local_c8 | bVar12;
      bVar7 = bVar21 | bVar10;
      bVar8 = bVar22 | bVar13;
      bVar9 = bVar3 | bVar15;
    } while ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
             &local_60._M_impl.super__Rb_tree_header);
    uVar18 = 7;
    if (bVar21 != 0 || bVar10) {
      uVar18 = 0x3f;
    }
    uVar17 = 0;
    if (0 < iVar1) {
      uVar17 = 0x3f;
    }
    if (local_c4 == 0 && !bVar11) {
      if (local_c8 != 0 || bVar12) {
        uVar18 = uVar18 | 0x800;
      }
    }
    else if (local_c8 == 0 && !bVar12) {
      uVar18 = uVar18 | 0x400;
    }
    else {
      uVar18 = uVar18 | 0xc00;
    }
    bVar10 = bVar16;
    if ((bVar22 != 0 || bVar13) || (bVar10 = true, bVar16)) {
      if (bVar4) {
        uVar18 = uVar18 | 0x2380;
      }
      else {
        uVar18 = uVar18 | 0x2000;
      }
    }
    else {
      bVar10 = false;
      if (bVar4) {
        uVar18 = uVar18 | 0x380;
      }
    }
    if (bVar3 != 0 || bVar15) {
      uVar18 = uVar18 | 0x1000;
    }
    if (bVar10) {
      uVar18 = uVar18 + (uVar18 & 6) * 0x4000 + 0x4000;
    }
  }
  uVar19 = uVar18;
  if ((pGVar2->OutputParticlePotential).super_ParameterBase.field_0x2b != '\0') {
    uVar19 = uVar18 | 0x40;
  }
  if (((pGVar2->PrintHeatFlux).super_ParameterBase.empty_ == false) &&
     ((pGVar2->PrintHeatFlux).super_ParameterBase.field_0x2b != '\0')) {
    uVar19 = uVar18 | 0x40;
  }
  bVar4 = ((pGVar2->UniformField).super_ParameterBase.empty_ &
           (pGVar2->ElectricField).super_ParameterBase.empty_ &
           (pGVar2->UniformGradientStrength).super_ParameterBase.empty_ &
           (pGVar2->UniformGradientDirection1).super_ParameterBase.empty_ &
          (pGVar2->UniformGradientDirection2).super_ParameterBase.empty_) == 1;
  bVar10 = (pGVar2->OutputElectricField).super_ParameterBase.field_0x2b == '\0';
  bVar16 = (pGVar2->lightPars_->UseLight).super_ParameterBase.field_0x2b == '\0';
  uVar18 = uVar19;
  if ((!bVar4 || !bVar10) || !bVar16) {
    uVar18 = uVar19 | 0x1000;
  }
  uVar20 = uVar17 | 0x1000;
  if ((bVar4 && bVar10) && bVar16) {
    uVar20 = uVar17;
  }
  this_00 = pGVar2->rnemdPars_;
  if (((this_00->UseRNEMD).super_ParameterBase.empty_ == false) &&
     ((this_00->UseRNEMD).super_ParameterBase.field_0x2b == '\x01')) {
    bVar16 = RNEMD::RNEMDParameters::requiresElectricField(this_00);
    if (bVar16) {
      uVar20 = uVar20 | 0x1000;
      uVar18 = uVar19 | 0x1000;
    }
  }
  uVar17 = uVar20 | 0x20000;
  uVar19 = uVar18 | 0x20000;
  if ((pGVar2->OutputSitePotential).super_ParameterBase.field_0x2b == '\0') {
    uVar17 = uVar20;
    uVar19 = uVar18;
  }
  uVar18 = uVar19 | 0x1c000;
  if ((pGVar2->OutputFluctuatingCharges).super_ParameterBase.field_0x2b == '\0') {
    uVar18 = uVar19;
  }
  info->atomStorageLayout_ = uVar18;
  info->rigidBodyStorageLayout_ = uVar17;
  info->cutoffGroupStorageLayout_ = 1;
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void SimCreator::computeStorageLayouts(SimInfo* info) {
    Globals* simParams    = info->getSimParams();
    int nRigidBodies      = info->getNGlobalRigidBodies();
    AtomTypeSet atomTypes = info->getSimulatedAtomTypes();
    AtomTypeSet::iterator i;
    bool hasDirectionalAtoms     = false;
    bool hasFixedCharge          = false;
    bool hasDipoles              = false;
    bool hasQuadrupoles          = false;
    bool hasPolarizable          = false;
    bool hasFluctuatingCharge    = false;
    bool hasMetallic             = false;
    int atomStorageLayout        = 0;
    int rigidBodyStorageLayout   = 0;
    int cutoffGroupStorageLayout = 0;

    atomStorageLayout |= DataStorage::dslPosition;
    atomStorageLayout |= DataStorage::dslVelocity;
    atomStorageLayout |= DataStorage::dslForce;
    cutoffGroupStorageLayout |= DataStorage::dslPosition;

    for (i = atomTypes.begin(); i != atomTypes.end(); ++i) {
      DirectionalAdapter da        = DirectionalAdapter((*i));
      MultipoleAdapter ma          = MultipoleAdapter((*i));
      EAMAdapter ea                = EAMAdapter((*i));
      SuttonChenAdapter sca        = SuttonChenAdapter((*i));
      PolarizableAdapter pa        = PolarizableAdapter((*i));
      FixedChargeAdapter fca       = FixedChargeAdapter((*i));
      FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter((*i));

      if (da.isDirectional()) { hasDirectionalAtoms = true; }
      if (ma.isDipole()) { hasDipoles = true; }
      if (ma.isQuadrupole()) { hasQuadrupoles = true; }
      if (ea.isEAM() || sca.isSuttonChen()) { hasMetallic = true; }
      if (fca.isFixedCharge()) { hasFixedCharge = true; }
      if (fqa.isFluctuatingCharge()) { hasFluctuatingCharge = true; }
      if (pa.isPolarizable()) { hasPolarizable = true; }
    }

    if (nRigidBodies > 0) {
      rigidBodyStorageLayout |= DataStorage::dslPosition;
      rigidBodyStorageLayout |= DataStorage::dslVelocity;
      rigidBodyStorageLayout |= DataStorage::dslForce;
      rigidBodyStorageLayout |= DataStorage::dslAmat;
      rigidBodyStorageLayout |= DataStorage::dslAngularMomentum;
      rigidBodyStorageLayout |= DataStorage::dslTorque;
    }
    if (hasDirectionalAtoms) {
      atomStorageLayout |= DataStorage::dslAmat;
      if (atomStorageLayout & DataStorage::dslVelocity) {
        atomStorageLayout |= DataStorage::dslAngularMomentum;
      }
      if (atomStorageLayout & DataStorage::dslForce) {
        atomStorageLayout |= DataStorage::dslTorque;
      }
    }
    if (hasDipoles) { atomStorageLayout |= DataStorage::dslDipole; }
    if (hasQuadrupoles) { atomStorageLayout |= DataStorage::dslQuadrupole; }
    if (hasFixedCharge || hasFluctuatingCharge) {
      atomStorageLayout |= DataStorage::dslSkippedCharge;
    }
    if (hasMetallic) {
      atomStorageLayout |= DataStorage::dslDensity;
      atomStorageLayout |= DataStorage::dslFunctional;
      atomStorageLayout |= DataStorage::dslFunctionalDerivative;
    }
    if (hasPolarizable) { atomStorageLayout |= DataStorage::dslElectricField; }
    if (hasFluctuatingCharge) {
      atomStorageLayout |= DataStorage::dslFlucQPosition;
      if (atomStorageLayout & DataStorage::dslVelocity) {
        atomStorageLayout |= DataStorage::dslFlucQVelocity;
      }
      if (atomStorageLayout & DataStorage::dslForce) {
        atomStorageLayout |= DataStorage::dslFlucQForce;
      }
    }

    // if the user has asked for them, make sure we've got the memory for the
    // objects defined.

    if (simParams->getOutputParticlePotential()) {
      atomStorageLayout |= DataStorage::dslParticlePot;
    }

    if (simParams->havePrintHeatFlux()) {
      if (simParams->getPrintHeatFlux()) {
        atomStorageLayout |= DataStorage::dslParticlePot;
      }
    }

    if (simParams->getOutputElectricField() | simParams->haveElectricField() |
        simParams->haveUniformField() |
        simParams->haveUniformGradientStrength() |
        simParams->haveUniformGradientDirection1() |
        simParams->haveUniformGradientDirection2() |
        simParams->getLightParameters()->getUseLight()) {
      atomStorageLayout |= DataStorage::dslElectricField;
      rigidBodyStorageLayout |= DataStorage::dslElectricField;
    }

    if (simParams->getRNEMDParameters()->haveUseRNEMD()) {
      if (simParams->getRNEMDParameters()->getUseRNEMD()) {
        if (simParams->getRNEMDParameters()->requiresElectricField()) {
          atomStorageLayout |= DataStorage::dslElectricField;
          rigidBodyStorageLayout |= DataStorage::dslElectricField;
        }
      }
    }

    if (simParams->getOutputSitePotential()) {
      atomStorageLayout |= DataStorage::dslSitePotential;
      rigidBodyStorageLayout |= DataStorage::dslSitePotential;
    }

    if (simParams->getOutputFluctuatingCharges()) {
      atomStorageLayout |= DataStorage::dslFlucQPosition;
      atomStorageLayout |= DataStorage::dslFlucQVelocity;
      atomStorageLayout |= DataStorage::dslFlucQForce;
    }

    info->setAtomStorageLayout(atomStorageLayout);
    info->setRigidBodyStorageLayout(rigidBodyStorageLayout);
    info->setCutoffGroupStorageLayout(cutoffGroupStorageLayout);

    return;
  }